

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  cpp *this_00;
  pointer pcVar1;
  FieldGenerator *pFVar2;
  LogMessage *pLVar3;
  undefined8 *puVar4;
  pointer ppFVar5;
  ulong uVar6;
  Descriptor *pDVar7;
  char cVar8;
  uint uVar9;
  string *value1;
  size_type *psVar10;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar12;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint i;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar13;
  FieldDescriptor *field;
  ulong uVar14;
  ulong extraout_RDX_01;
  FieldDescriptor *field_00;
  size_type sVar15;
  int iVar16;
  char *pcVar17;
  AlphaNum *pAVar18;
  long *plVar19;
  int iVar20;
  ulong uVar21;
  protobuf *this_01;
  FieldGeneratorMap *pFVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  bool bVar27;
  Hex hex;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  string local_2c8;
  int local_2a4;
  FieldGeneratorMap *local_2a0;
  string local_298;
  uint local_278;
  int local_274;
  undefined1 local_270 [56];
  string m;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  long *local_1d8;
  undefined8 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  string result;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  protobuf *ppVar11;
  
  pDVar7 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar7 + 8));
    if ((this->options_).enforce_lite == false) {
      bVar27 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3;
    }
    else {
      bVar27 = false;
    }
    if (!bVar27) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_270,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf64);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)local_270,
                          "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)local_270);
    }
    io::Printer::Print(printer,
                       "if (_internal_metadata_.have_unknown_fields()) {\n  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n}\n"
                      );
    pcVar17 = 
    "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = cached_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
    ;
    goto LAB_0025b67e;
  }
  if ((1 < this->num_required_fields_) && (*(int *)(*(long *)(pDVar7 + 0x10) + 0x8c) != 3)) {
    io::Printer::Print(printer,
                       "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
                       ,"classname",&this->classname_,"full_name",*(string **)(pDVar7 + 8));
    io::Printer::Indent(printer);
    io::Printer::Print(printer,"size_t total_size = 0;\n");
    ppFVar5 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->optimized_order_).
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
      uVar24 = 0;
      pFVar13 = extraout_RDX;
      do {
        this_00 = (cpp *)ppFVar5[uVar24];
        if (*(int *)(this_00 + 0x4c) == 2) {
          FieldName_abi_cxx11_((string *)local_270,this_00,pFVar13);
          io::Printer::Print(printer,"\nif (has_$name$()) {\n","name",(string *)local_270);
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                    (printer,(FieldDescriptor *)this_00);
          pFVar2 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          pFVar13 = extraout_RDX_00;
        }
        uVar24 = uVar24 + 1;
        ppFVar5 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(this->optimized_order_).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >>
                               3));
    }
    io::Printer::Print(printer,"\nreturn total_size;\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  value1 = &this->classname_;
  pAVar18 = (AlphaNum *)0x36718c;
  io::Printer::Print(printer,
                     "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
                     ,"classname",value1,"full_name",*(string **)(this->descriptor_ + 8));
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"size_t total_size = 0;\n\n");
  if (0 < *(int *)(this->descriptor_ + 0x68)) {
    io::Printer::Print(printer,"total_size += _extensions_.ByteSize();\n\n");
  }
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
    if (((this->options_).enforce_lite == false) &&
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 3)) {
      pcVar17 = 
      "if (_internal_metadata_.have_unknown_fields()) {\n  total_size +=\n    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n      unknown_fields());\n}\n"
      ;
    }
    else {
      pcVar17 = "total_size += unknown_fields().size();\n\n";
    }
    io::Printer::Print(printer,pcVar17);
  }
  if ((this->num_required_fields_ < 2) ||
     (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3)) {
    ppFVar5 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->optimized_order_).
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
      uVar24 = 0;
      do {
        pFVar13 = ppFVar5[uVar24];
        if (*(int *)(pFVar13 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar13);
          FieldName_abi_cxx11_((string *)local_270,(cpp *)pFVar13,field);
          io::Printer::Print(printer,"if (has_$name$()) {\n","name",(string *)local_270);
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
          }
          io::Printer::Indent(printer);
          pFVar2 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
          (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
        uVar24 = uVar24 + 1;
        ppFVar5 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(this->optimized_order_).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >>
                               3));
    }
  }
  else {
    RequiredFieldsBitMask(&masks_for_has_bits,this);
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"if (","");
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar17 = (char *)((long)&local_148 + 0x10);
      uVar24 = 0;
      do {
        if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar24] != 0) {
          pAVar18 = (AlphaNum *)0x3b551d;
          local_270._0_8_ = "0x";
          local_270._8_8_ = (char *)0x2;
          hex.value = (ulong)masks_for_has_bits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar24];
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)&local_148,hex);
          StrCat_abi_cxx11_(&m,(protobuf *)local_270,(AlphaNum *)&local_148,pAVar18);
          local_270._0_8_ = "((_has_bits_[";
          local_270._8_8_ = (char *)0xd;
          local_148._0_8_ = pcVar17;
          local_148.filename_ = FastInt32ToBufferLeft((int32)uVar24,pcVar17);
          local_148.filename_ = local_148.filename_ + -(long)pcVar17;
          local_d8._0_8_ = "] & ";
          local_d8.filename_ = (char *)0x4;
          local_110._0_8_ = m._M_dataplus._M_p;
          local_110.filename_ = (char *)m._M_string_length;
          result._M_dataplus._M_p = ") ^ ";
          result._M_string_length = 4;
          local_68._0_8_ = m._M_dataplus._M_p;
          local_68.filename_ = (char *)m._M_string_length;
          local_a0._0_8_ = ")";
          local_a0.filename_ = (char *)0x1;
          pAVar18 = (AlphaNum *)&local_110;
          StrCat_abi_cxx11_(&local_2c8,(protobuf *)local_270,(AlphaNum *)&local_148,
                            (AlphaNum *)&local_d8,pAVar18,(AlphaNum *)&result,(AlphaNum *)&local_68,
                            (AlphaNum *)&local_a0,
                            (AlphaNum *)
                            CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                     &local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)m._M_dataplus._M_p != &m.field_2) {
            operator_delete(m._M_dataplus._M_p,m.field_2._M_allocated_capacity + 1);
          }
        }
        uVar24 = uVar24 + 1;
        value1 = (string *)
                 ((long)masks_for_has_bits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)masks_for_has_bits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2);
      } while (uVar24 < value1);
    }
    if (parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      value1 = (string *)0xf54;
      internal::LogMessage::LogMessage
                ((LogMessage *)local_270,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xf54);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)local_270,"CHECK failed: !parts.empty(): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)local_270);
    }
    if ((long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)parts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      result._M_dataplus._M_p = (pointer)&result.field_2;
      pcVar1 = ((parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&result,pcVar1,
                 pcVar1 + (parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    }
    else {
      local_148._0_8_ = "(";
      local_148.filename_ = (char *)0x1;
      Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&m,(protobuf *)&parts,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)"\n       | ",(char *)value1);
      local_d8._0_8_ = m._M_dataplus._M_p;
      local_d8.filename_ = (char *)m._M_string_length;
      local_110._0_8_ = ")";
      local_110.filename_ = (char *)0x1;
      StrCat_abi_cxx11_(&result,(protobuf *)&local_148,(AlphaNum *)&local_d8,(AlphaNum *)&local_110,
                        pAVar18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)m._M_dataplus._M_p != &m.field_2) {
        operator_delete(m._M_dataplus._M_p,m.field_2._M_allocated_capacity + 1);
      }
    }
    local_218 = local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    std::__cxx11::string::append((char *)&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
    uVar24 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar24 = local_1a8[0];
    }
    if (uVar24 < (ulong)(local_210 + local_1b0)) {
      uVar24 = 0xf;
      if (local_218 != local_208) {
        uVar24 = local_208[0];
      }
      if (uVar24 < (ulong)(local_210 + local_1b0)) goto LAB_0025abf9;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1b8);
    }
    else {
LAB_0025abf9:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_218);
    }
    local_1d8 = &local_1c8;
    plVar19 = puVar4 + 2;
    if ((long *)*puVar4 == plVar19) {
      local_1c8 = *plVar19;
      uStack_1c0 = puVar4[3];
    }
    else {
      local_1c8 = *plVar19;
      local_1d8 = (long *)*puVar4;
    }
    local_1d0 = puVar4[1];
    *puVar4 = plVar19;
    puVar4[1] = 0;
    *(undefined1 *)plVar19 = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    psVar10 = (size_type *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298.field_2._8_8_ = plVar19[3];
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = *psVar10;
      local_298._M_dataplus._M_p = (pointer)*plVar19;
    }
    local_298._M_string_length = plVar19[1];
    *plVar19 = (long)psVar10;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    io::Printer::Print(printer,local_298._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,local_1c8 + 1);
    }
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    io::Printer::Indent(printer);
    ppFVar5 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->optimized_order_).
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
      uVar24 = 0;
      do {
        pFVar13 = ppFVar5[uVar24];
        if (*(int *)(pFVar13 + 0x4c) == 2) {
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar13);
          pFVar2 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
          (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
          io::Printer::Print(printer,"\n");
        }
        uVar24 = uVar24 + 1;
        ppFVar5 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)((long)(this->optimized_order_).
                                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >>
                               3));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(masks_for_has_bits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)masks_for_has_bits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2a0 = &this->field_generators_;
    uVar24 = 0;
    iVar16 = -1;
    do {
      iVar20 = (int)uVar24;
      if (iVar20 == iVar16) {
        internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0xfd8);
        pLVar3 = internal::LogMessage::operator<<(&local_148,"CHECK failed: (i) != (last_i): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
        internal::LogMessage::~LogMessage(&local_148);
      }
      ppFVar5 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = (long)(this->optimized_order_).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3;
      uVar6 = (ulong)iVar20;
      if (uVar6 < uVar14) {
        do {
          if (*(int *)(ppFVar5[uVar6] + 0x4c) != 2) break;
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar14);
        uVar24 = uVar6 & 0xffffffff;
      }
      uVar6 = (ulong)(int)uVar24;
      ppFVar5 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_274 = iVar20;
      if (uVar6 < (ulong)((long)(this->optimized_order_).
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)) {
        do {
          pFVar13 = ppFVar5[uVar6];
          if (*(int *)(pFVar13 + 0x4c) != 3) break;
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar13);
          pFVar2 = FieldGeneratorMap::get(local_2a0,pFVar13);
          (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
          io::Printer::Print(printer,"\n");
          uVar6 = uVar6 + 1;
          ppFVar5 = (this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(this->optimized_order_).
                                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >>
                                3));
        uVar24 = uVar6 & 0xffffffff;
      }
      ppFVar5 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3;
      uVar14 = (ulong)(int)uVar24;
      if (uVar14 < uVar6) {
        uVar24 = 0xffffffff;
        this_01 = (protobuf *)0x0;
        uVar21 = 0xffffffff;
        iVar16 = -1;
        do {
          pFVar13 = ppFVar5[uVar14];
          bVar27 = false;
          uVar12 = 0;
          if ((*(uint *)(pFVar13 + 0x4c) & 0xfffffffe) != 2) {
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3) {
              if (pFVar13[0x50] == (FieldDescriptor)0x0) {
                plVar19 = (long *)(*(long *)(pFVar13 + 0x58) + 0x30);
              }
              else if (*(long *)(pFVar13 + 0x68) == 0) {
                plVar19 = (long *)(*(long *)(pFVar13 + 0x30) + 0x98);
              }
              else {
                plVar19 = (long *)(*(long *)(pFVar13 + 0x68) + 0x80);
              }
              uVar12 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [(int)((ulong)((long)pFVar13 - *plVar19) >> 3) * 0x3cf3cf3d];
            }
            uVar9 = uVar12 + 7;
            if (-1 < (int)uVar12) {
              uVar9 = uVar12;
            }
            iVar20 = (int)uVar9 >> 3;
            if (iVar16 == -1) {
              uVar21 = uVar14 & 0xffffffff;
            }
            else {
              bVar27 = iVar20 != iVar16;
              iVar20 = iVar16;
              if (bVar27) {
                bVar27 = false;
                goto LAB_0025b01f;
              }
            }
            this_01 = (protobuf *)(ulong)((uint)this_01 | 1 << (uVar12 & 0x1f));
            bVar27 = true;
            uVar24 = uVar14 & 0xffffffff;
            iVar16 = iVar20;
          }
LAB_0025b01f:
          iVar26 = (int)uVar21;
          iVar20 = (int)uVar24;
        } while ((bVar27) && (uVar14 = uVar14 + 1, uVar14 < uVar6));
        uVar24 = uVar14 & 0xffffffff;
      }
      else {
        this_01 = (protobuf *)0x0;
        iVar16 = -1;
        iVar26 = -1;
        iVar20 = -1;
      }
      if (iVar16 != -1) {
        local_278 = (uint)uVar24;
        local_2a4 = iVar26;
        if (iVar26 == -1) {
          internal::LogMessage::LogMessage
                    (&local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1013);
          pLVar3 = internal::LogMessage::operator<<
                             (&local_d8,"CHECK failed: (-1) != (last_chunk_start): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
          internal::LogMessage::~LogMessage(&local_d8);
          uVar6 = extraout_RDX_01;
        }
        uVar12 = (uint)uVar6;
        if (iVar20 == -1) {
          internal::LogMessage::LogMessage
                    (&local_110,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1014);
          pLVar3 = internal::LogMessage::operator<<
                             (&local_110,"CHECK failed: (-1) != (last_chunk_end): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
          internal::LogMessage::~LogMessage(&local_110);
          uVar12 = extraout_EDX;
        }
        if ((int)this_01 == 0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&result,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1015);
          pLVar3 = internal::LogMessage::operator<<
                             ((LogMessage *)&result,"CHECK failed: (0) != (last_chunk_mask): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
          internal::LogMessage::~LogMessage((LogMessage *)&result);
          uVar12 = extraout_EDX_00;
        }
        iVar26 = 0;
        ppVar11 = this_01;
        if ((int)this_01 != 0) {
          do {
            uVar9 = (uint)ppVar11;
            uVar12 = uVar9 & 1;
            iVar26 = iVar26 + uVar12;
            ppVar11 = (protobuf *)((ulong)ppVar11 >> 1);
          } while (1 < uVar9);
        }
        bVar27 = *(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) != 3;
        cVar8 = local_2a4 != iVar20 && bVar27;
        if (local_2a4 != iVar20 && bVar27) {
          if (iVar26 < 2) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x101f);
            pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (2) <= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
            internal::LogMessage::~LogMessage(&local_68);
            uVar12 = extraout_EDX_01;
          }
          if (8 < iVar26) {
            internal::LogMessage::LogMessage
                      (&local_a0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0x1020);
            pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (8) >= (count): ");
            internal::LogFinisher::operator=((LogFinisher *)&local_2c8,pLVar3);
            internal::LogMessage::~LogMessage(&local_a0);
            uVar12 = extraout_EDX_02;
          }
          SimpleItoa_abi_cxx11_(&local_2c8,(protobuf *)(ulong)(uint)(iVar16 << 3),uVar12);
          SimpleItoa_abi_cxx11_(&local_298,this_01,i);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & $mask$u) {\n","index",
                             &local_2c8,"mask",&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
        }
        if (local_2a4 <= iVar20) {
          lVar25 = (long)local_2a4;
          iVar16 = (iVar20 - local_2a4) + 1;
          do {
            pFVar13 = (this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar25];
            pFVar2 = FieldGeneratorMap::get(local_2a0,pFVar13);
            anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar13);
            if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"this->","");
              bVar27 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,&local_2c8,pFVar13);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
              if (bVar27) goto LAB_0025b3f4;
            }
            else {
              FieldName_abi_cxx11_(&local_2c8,(cpp *)pFVar13,field_00);
              io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              io::Printer::Indent(printer);
              (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
LAB_0025b3f4:
              io::Printer::Outdent(printer);
              io::Printer::Print(printer,"}\n\n");
            }
            lVar25 = lVar25 + 1;
            iVar16 = iVar16 + -1;
          } while (iVar16 != 0);
        }
        uVar24 = (ulong)local_278;
        if (cVar8 != '\0') {
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
        }
      }
      iVar16 = local_274;
    } while ((ulong)(long)(int)uVar24 <
             (ulong)((long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->optimized_order_).
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pDVar7 = this->descriptor_;
  if (0 < *(int *)(pDVar7 + 0x38)) {
    pFVar22 = (FieldGeneratorMap *)0x0;
    do {
      io::Printer::Print(printer,"switch ($oneofname$_case()) {\n","oneofname",
                         *(string **)(*(long *)(pDVar7 + 0x40) + (long)pFVar22 * 0x30));
      io::Printer::Indent(printer);
      lVar25 = *(long *)(this->descriptor_ + 0x40);
      local_2a0 = pFVar22;
      if (0 < *(int *)(lVar25 + 0x1c + (long)pFVar22 * 0x30)) {
        lVar23 = 0;
        do {
          pFVar13 = *(FieldDescriptor **)
                     (*(long *)(lVar25 + 0x20 + (long)pFVar22 * 0x30) + lVar23 * 8);
          anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>(printer,pFVar13);
          UnderscoresToCamelCase(&local_2c8,*(string **)pFVar13,true);
          io::Printer::Print(printer,"case k$field_name$: {\n","field_name",&local_2c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
          pFVar2 = FieldGeneratorMap::get(&this->field_generators_,pFVar13);
          (*pFVar2->_vptr_FieldGenerator[0x17])(pFVar2,printer);
          io::Printer::Print(printer,"break;\n");
          io::Printer::Outdent(printer);
          io::Printer::Print(printer,"}\n");
          lVar23 = lVar23 + 1;
          lVar25 = *(long *)(this->descriptor_ + 0x40);
        } while (lVar23 < *(int *)(lVar25 + 0x1c + (long)pFVar22 * 0x30));
      }
      plVar19 = *(long **)(lVar25 + (long)pFVar22 * 0x30);
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
      lVar25 = *plVar19;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,lVar25,plVar19[1] + lVar25);
      if (local_2c8._M_string_length != 0) {
        sVar15 = 0;
        do {
          if ((byte)(local_2c8._M_dataplus._M_p[sVar15] + 0x9fU) < 0x1a) {
            local_2c8._M_dataplus._M_p[sVar15] = local_2c8._M_dataplus._M_p[sVar15] + -0x20;
          }
          sVar15 = sVar15 + 1;
        } while (local_2c8._M_string_length != sVar15);
      }
      io::Printer::Print(printer,"case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n","cap_oneof_name",
                         &local_2c8);
      pFVar22 = local_2a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pFVar22 = (FieldGeneratorMap *)((long)&pFVar22->descriptor_ + 1);
      pDVar7 = this->descriptor_;
    } while ((long)pFVar22 < (long)*(int *)(pDVar7 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  io::Printer::Print(printer,
                     "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = cached_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                    );
  io::Printer::Outdent(printer);
  pcVar17 = "}\n";
LAB_0025b67e:
  io::Printer::Print(printer,pcVar17);
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "if (_internal_metadata_.have_unknown_fields()) {\n"
      "  total_size += ::google::protobuf::internal::WireFormat::\n"
      "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
      "}\n");
    printer->Print(
      "  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = cached_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    printer->Print(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n",
        "classname", classname_, "full_name", descriptor_->full_name());
    printer->Indent();
    printer->Print("size_t total_size = 0;\n");
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_required()) {
        printer->Print("\n"
                       "if (has_$name$()) {\n",
                       "name", FieldName(field));
        printer->Indent();
        PrintFieldComment(printer, field);
        field_generators_.get(field).GenerateByteSize(printer);
        printer->Outdent();
        printer->Print("}\n");
      }
    }
    printer->Print("\n"
                   "return total_size;\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  printer->Print(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n",
      "classname", classname_, "full_name", descriptor_->full_name());
  printer->Indent();
  printer->Print(
    "size_t total_size = 0;\n"
    "\n");

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(
        "if (_internal_metadata_.have_unknown_fields()) {\n"
        "  total_size +=\n"
        "    ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
        "      unknown_fields());\n"
        "}\n");
    } else {
      printer->Print(
        "total_size += unknown_fields().size();\n"
        "\n");
    }
  }

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1 && HasFieldPresence(descriptor_->file())) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    printer->Print((string("if (") +
                    ConditionalToCheckBitmasks(masks_for_has_bits) +
                    ") {  // All required fields are present.\n").c_str());
    printer->Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
    printer->Outdent();
    printer->Print("} else {\n"  // the slow path
                   "  total_size += RequiredFieldsByteSizeFallback();\n"
                   "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (int i = 0; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_required()) continue;
      PrintFieldComment(printer, field);
      printer->Print("if (has_$name$()) {\n",
                     "name", FieldName(field));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Outdent();
      printer->Print("}\n");
    }
  }

  int last_i = -1;
  for (int i = 0; i < optimized_order_.size(); ) {
    // Detect infinite loops.
    GOOGLE_CHECK_NE(i, last_i);
    last_i = i;

    // Skip required fields.
    for (; i < optimized_order_.size() &&
         optimized_order_[i]->is_required(); i++) {
    }

    // Handle repeated fields.
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (!field->is_repeated()) {
        break;
      }

      PrintFieldComment(printer, field);
      const FieldGenerator& generator = field_generators_.get(field);
      generator.GenerateByteSize(printer);
      printer->Print("\n");
    }

    // Handle optional (non-repeated/oneof) fields.
    //
    // These are handled in chunks of 8.  The first chunk is
    // the non-requireds-non-repeateds-non-unions-non-extensions in
    //  descriptor_->field(0), descriptor_->field(1), ... descriptor_->field(7),
    // and the second chunk is the same for
    //  descriptor_->field(8), descriptor_->field(9), ...
    //  descriptor_->field(15),
    // etc.
    int last_chunk = -1;
    int last_chunk_start = -1;
    int last_chunk_end = -1;
    uint32 last_chunk_mask = 0;
    for (; i < optimized_order_.size(); i++) {
      const FieldDescriptor* field = optimized_order_[i];
      if (field->is_repeated() || field->is_required()) {
        break;
      }

      // "index" defines where in the _has_bits_ the field appears.
      // "i" is our loop counter within optimized_order_.
      int index = HasFieldPresence(descriptor_->file()) ?
          has_bit_indices_[field->index()] : 0;
      int chunk = index / 8;

      if (last_chunk == -1) {
        last_chunk = chunk;
        last_chunk_start = i;
      } else if (chunk != last_chunk) {
        // Emit the fields for this chunk so far.
        break;
      }

      last_chunk_end = i;
      last_chunk_mask |= static_cast<uint32>(1) << (index % 32);
    }

    if (last_chunk != -1) {
      GOOGLE_DCHECK_NE(-1, last_chunk_start);
      GOOGLE_DCHECK_NE(-1, last_chunk_end);
      GOOGLE_DCHECK_NE(0, last_chunk_mask);

      const int count = popcnt(last_chunk_mask);
      const bool have_outer_if = HasFieldPresence(descriptor_->file()) &&
          (last_chunk_start != last_chunk_end);

      if (have_outer_if) {
        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        GOOGLE_DCHECK_LE(2, count);
        GOOGLE_DCHECK_GE(8, count);

        printer->Print(
          "if (_has_bits_[$index$ / 32] & $mask$u) {\n",
          "index", SimpleItoa(last_chunk * 8),
          "mask", SimpleItoa(last_chunk_mask));
        printer->Indent();
      }

      // Go back and emit checks for each of the fields we processed.
      for (int j = last_chunk_start; j <= last_chunk_end; j++) {
        const FieldDescriptor* field = optimized_order_[j];
        const FieldGenerator& generator = field_generators_.get(field);

        PrintFieldComment(printer, field);

        bool have_enclosing_if = false;
        if (HasFieldPresence(descriptor_->file())) {
          printer->Print(
            "if (has_$name$()) {\n",
            "name", FieldName(field));
          printer->Indent();
          have_enclosing_if = true;
        } else {
          // Without field presence: field is serialized only if it has a
          // non-default value.
          have_enclosing_if = EmitFieldNonDefaultCondition(
              printer, "this->", field);
        }

        generator.GenerateByteSize(printer);

        if (have_enclosing_if) {
          printer->Outdent();
          printer->Print(
            "}\n"
            "\n");
        }
      }

      if (have_outer_if) {
        printer->Outdent();
        printer->Print("}\n");
      }
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "switch ($oneofname$_case()) {\n",
        "oneofname", descriptor_->oneof_decl(i)->name());
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      PrintFieldComment(printer, field);
      printer->Print(
          "case k$field_name$: {\n",
          "field_name", UnderscoresToCamelCase(field->name(), true));
      printer->Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
        "case $cap_oneof_name$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        "cap_oneof_name",
        ToUpper(descriptor_->oneof_decl(i)->name()));
    printer->Outdent();
    printer->Print(
        "}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    printer->Print("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = cached_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}